

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

int __thiscall
asl::Array<wchar_t>::clone
          (Array<wchar_t> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int m;
  long lVar1;
  wchar_t *pwVar2;
  long lVar3;
  
  lVar1 = *(long *)__fn;
  m = *(int *)(lVar1 + -0x10);
  alloc(this,m);
  if (0 < (long)m) {
    pwVar2 = this->_a;
    lVar3 = 0;
    do {
      pwVar2[lVar3] = *(wchar_t *)(lVar1 + lVar3 * 4);
      lVar3 = lVar3 + 1;
    } while (m != lVar3);
  }
  return (int)this;
}

Assistant:

Array clone() const
	{
		Array b(_a, length());
		return b;
	}